

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-textblock.c
# Opt level: O0

void textblock_to_file(textblock *tb,ang_file *f,wchar_t indent,wchar_t wrap_at)

{
  wchar_t wVar1;
  size_t sVar2;
  char *s;
  wchar_t nc;
  wchar_t width;
  char *mbbuf;
  size_t j;
  size_t i;
  size_t n_lines;
  size_t *line_lengths;
  size_t *line_starts;
  wchar_t wrap_at_local;
  wchar_t indent_local;
  ang_file *f_local;
  textblock *tb_local;
  
  line_lengths = (size_t *)0x0;
  n_lines = 0;
  line_starts._0_4_ = wrap_at;
  line_starts._4_4_ = indent;
  _wrap_at_local = f;
  f_local = (ang_file *)tb;
  if (0 < wrap_at - indent) {
    sVar2 = textblock_calculate_lines(tb,&line_lengths,(size_t **)&n_lines,(long)(wrap_at - indent))
    ;
    wVar1 = text_wcsz();
    s = (char *)mem_alloc((long)(wVar1 + L'\x01'));
    for (j = 0; j < sVar2; j = j + 1) {
      if (L'\0' < line_starts._4_4_) {
        file_putf(_wrap_at_local,"%*c",(ulong)(uint)line_starts._4_4_,0x20);
      }
      mbbuf = (char *)0x0;
      while( true ) {
        if (*(char **)(n_lines + j * 8) <= mbbuf) break;
        wVar1 = text_wctomb(s,(&f_local->fh->_flags)[(long)(mbbuf + line_lengths[j])]);
        if (wVar1 < L'\x01') {
          *s = ' ';
          s[1] = '\0';
        }
        else {
          s[wVar1] = '\0';
        }
        file_putf(_wrap_at_local,"%s",s);
        mbbuf = mbbuf + 1;
      }
      file_putf(_wrap_at_local,"\n");
    }
    mem_free(s);
    mem_free(line_lengths);
    mem_free((void *)n_lines);
    return;
  }
  __assert_fail("width > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-textblock.c"
                ,0x14a,"void textblock_to_file(textblock *, ang_file *, int, int)");
}

Assistant:

void textblock_to_file(textblock *tb, ang_file *f, int indent, int wrap_at)
{
	size_t *line_starts = NULL;
	size_t *line_lengths = NULL;

	size_t n_lines, i, j;
	char *mbbuf;

	int width = wrap_at - indent;
	assert(width > 0);

	n_lines = textblock_calculate_lines(tb, &line_starts, &line_lengths, width);
	mbbuf = mem_alloc(text_wcsz() + 1);

	for (i = 0; i < n_lines; i++) {
		if (indent > 0) {
			file_putf(f, "%*c", indent, ' ');
		}
		for (j = 0; j < line_lengths[i]; ++j) {
			int nc = text_wctomb(mbbuf,
				tb->text[line_starts[i] + j]);

			if (nc > 0) {
				mbbuf[nc] = 0;
			} else {
				mbbuf[0] = ' ';
				mbbuf[1] = 0;
			}
			file_putf(f, "%s", mbbuf);
		}
		file_putf(f, "\n");
	}

	mem_free(mbbuf);
	mem_free(line_starts);
	mem_free(line_lengths);
}